

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<long,unsigned_long,13>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int64_t *lhs,uint64_t *rhs,long *result)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  if (*in_RDI <= *in_RDI + *in_RSI) {
    *in_RDX = *in_RDI + *in_RSI;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}